

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleTimeScaleDirective(Preprocessor *this,Token directive)

{
  bool bVar1;
  bool bVar2;
  strong_ordering sVar3;
  _Storage<slang::TimeScale,_true> _Var4;
  Diagnostic *this_00;
  TimeScaleDirectiveSyntax *syntax;
  SourceRange SVar5;
  TimeScaleValue precision;
  TimeScaleValue unit;
  Token slash;
  Token precisionToken;
  Token unitToken;
  TimeScaleValue local_7c;
  TimeScaleValue local_7a;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_48.info = directive.info;
  local_48._0_8_ = directive._0_8_;
  if (0 < (int)(this->options).languageVersion) {
    checkOutsideDesignElement(this,directive);
  }
  Token::Token(&local_58);
  Token::Token(&local_68);
  local_7a.unit = Nanoseconds;
  local_7a.magnitude = One;
  local_7c.unit = Nanoseconds;
  local_7c.magnitude = One;
  bVar1 = expectTimeScaleSpecifier(this,&local_58,&local_7a);
  local_78 = expect(this,Slash);
  bVar2 = expectTimeScaleSpecifier(this,&local_68,&local_7c);
  if ((bVar1) || (bVar2)) {
    sVar3 = TimeScaleValue::operator<=>(&local_7c,&local_7a);
    if (sVar3._M_value < '\x01') {
      _Var4._M_value.precision = local_7c;
      _Var4._M_value.base = local_7a;
      if ((this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
        (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
      }
      (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload = _Var4;
    }
    else {
      SVar5 = Token::range(&local_68);
      this_00 = Diagnostics::add(this->diagnostics,(DiagCode)0xe0004,SVar5);
      SVar5 = Token::range(&local_58);
      Diagnostic::operator<<(this_00,SVar5);
    }
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::TimeScaleDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_48,&local_58,&local_78,&local_68);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleTimeScaleDirective(Token directive) {
    if (options.languageVersion >= LanguageVersion::v1800_2023)
        checkOutsideDesignElement(directive);

    Token unitToken, precisionToken;
    TimeScaleValue unit, precision;
    bool success = expectTimeScaleSpecifier(unitToken, unit);

    auto slash = expect(TokenKind::Slash);
    success |= expectTimeScaleSpecifier(precisionToken, precision);

    if (success) {
        // Precision must be equal to or smaller than the unit (i.e. more precise).
        if (precision > unit) {
            auto& diag = addDiag(diag::InvalidTimeScalePrecision, precisionToken.range());
            diag << unitToken.range();
        }
        else {
            activeTimeScale = {unit, precision};
        }
    }

    auto timeScale = alloc.emplace<TimeScaleDirectiveSyntax>(directive, unitToken, slash,
                                                             precisionToken);
    return Trivia(TriviaKind::Directive, timeScale);
}